

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O2

void __thiscall LogFile::append_unlocked(LogFile *this,char *logline,int len)

{
  int iVar1;
  
  AppendFile::append((this->file_)._M_t.
                     super___uniq_ptr_impl<AppendFile,_std::default_delete<AppendFile>_>._M_t.
                     super__Tuple_impl<0UL,_AppendFile_*,_std::default_delete<AppendFile>_>.
                     super__Head_base<0UL,_AppendFile_*,_false>._M_head_impl,logline,(long)len);
  iVar1 = this->count_ + 1;
  this->count_ = iVar1;
  if (iVar1 < this->flushEveryN_) {
    return;
  }
  this->count_ = 0;
  AppendFile::flush((this->file_)._M_t.
                    super___uniq_ptr_impl<AppendFile,_std::default_delete<AppendFile>_>._M_t.
                    super__Tuple_impl<0UL,_AppendFile_*,_std::default_delete<AppendFile>_>.
                    super__Head_base<0UL,_AppendFile_*,_false>._M_head_impl);
  return;
}

Assistant:

void LogFile::append_unlocked(const char* logline, int len) {
    file_->append(logline, len);
    ++count_;
    if (count_>=flushEveryN_) {
        count_ = 0;
        file_->flush();
    }
}